

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::logMessage
          (CommonCore *this,LocalFederateId federateID,int logLevel,string_view messageToLog)

{
  string_view message;
  bool bVar1;
  GlobalBrokerId id;
  FederateState *pFVar2;
  undefined8 uVar3;
  ActionMessage *in_RDI;
  ActionMessage log;
  FederateState *fed;
  GlobalFederateId gid;
  atomic<helics::GlobalFederateId> *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  action_t in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffefc;
  CommonCore *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  LocalFederateId in_stack_ffffffffffffff14;
  GlobalFederateId local_30;
  undefined4 local_2c;
  GlobalFederateId local_28 [9];
  LocalFederateId local_4;
  
  GlobalFederateId::GlobalFederateId(local_28);
  local_2c = 0xfffffefd;
  bVar1 = LocalFederateId::operator==(&local_4,(LocalFederateId)0xfffffefd);
  if (bVar1) {
    id = CLI::std::atomic<helics::GlobalBrokerId>::load
                   ((atomic<helics::GlobalBrokerId> *)&in_RDI->dest_id,seq_cst);
    GlobalFederateId::GlobalFederateId(&local_30,id);
    local_28[0].gid = local_30.gid;
  }
  else {
    pFVar2 = getFederateAt(in_stack_ffffffffffffff08,in_stack_ffffffffffffff14);
    if (pFVar2 == (FederateState *)0x0) {
      uVar3 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      message._M_len._4_4_ = in_stack_fffffffffffffeec;
      message._M_len._0_4_ = in_stack_fffffffffffffee8;
      message._M_str._0_4_ = in_stack_fffffffffffffef0;
      message._M_str._4_4_ = in_stack_fffffffffffffef4;
      InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffee0,message);
      __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    local_28[0] = std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffec8);
  }
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec);
  SmallBuffer::operator=
            ((SmallBuffer *)CONCAT44(in_stack_fffffffffffffefc,local_28[0].gid),
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffef4,local_28[0].gid));
  gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
  ::push<helics::ActionMessage&>
            ((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
             CONCAT44(in_stack_ffffffffffffff14.fid,in_stack_ffffffffffffff10),
             (ActionMessage *)in_stack_ffffffffffffff08);
  ActionMessage::~ActionMessage(in_RDI);
  return;
}

Assistant:

void CommonCore::logMessage(LocalFederateId federateID, int logLevel, std::string_view messageToLog)
{
    GlobalFederateId gid;
    if (federateID == gLocalCoreId) {
        gid = global_id.load();
    } else {
        auto* fed = getFederateAt(federateID);
        if (fed == nullptr) {
            throw(InvalidIdentifier("FederateID is not valid (logMessage)"));
        }
        gid = fed->global_id;
    }
    ActionMessage log(CMD_LOG);
    log.source_id = gid;
    log.dest_id = gid;
    log.messageID = logLevel;
    log.payload = messageToLog;
    actionQueue.push(log);
}